

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O3

int zueci_gb2312_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  int iVar2;
  zueci_u32 zVar3;
  uint uVar4;
  
  bVar1 = *src;
  zVar3 = (zueci_u32)bVar1;
  iVar2 = 1;
  if (-1 < (char)bVar1) {
LAB_00190431:
    *p_u = zVar3;
    return iVar2;
  }
  if ((((0xa0 < bVar1 && 1 < len) && (7 < bVar1 - 0xf8)) && (5 < bVar1 - 0xaa)) &&
     (0xa1 < (byte)(src[1] + 1))) {
    uVar4 = bVar1 - 6;
    if (bVar1 < 0xaa) {
      uVar4 = (uint)bVar1;
    }
    zVar3 = (zueci_u32)zueci_sjis_mb_u[(long)(int)(uVar4 * 0x5e + (uint)src[1]) + 0x1961];
    if (zVar3 != 0) {
      iVar2 = 2;
      goto LAB_00190431;
    }
  }
  return 0;
}

Assistant:

static int zueci_gb2312_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags, zueci_u32 *p_u) {
    unsigned char c1, c2;
    int ind;
    zueci_u32 u2;

    (void)flags;
    assert(len);

    c1 = src[0];
    if (c1 < 0x80) {
        *p_u = c1;
        return 1;
    }
    if (len < 2 || c1 < 0xA1 || (c1 > 0xA9 && c1 < 0xB0) || c1 > 0xF7) {
        return 0;
    }
    c2 = src[1];
    if (c2 < 0xA1 || c2 == 0xFF) {
        return 0;
    }
    ind = (0xFF - 0xA1) * (c1 - 0xA1 - (c1 > 0xA9) * (0xB0 - 0xAA)) + c2 - 0xA1;
    assert(ind < ZUECI_ASIZE(zueci_gb2312_mb_u));
    if ((u2 = zueci_gb2312_mb_u[ind])) {
        *p_u = u2;
        return 2;
    }
    return 0;
}